

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi-timeout.c
# Opt level: O0

void lws_sul_hrtimer_cb(lws_sorted_usec_list_t *sul)

{
  int iVar1;
  lws *wsi;
  lws_sorted_usec_list_t *sul_local;
  
  if (sul[6].us != 0) {
    iVar1 = (**(code **)(sul[6].us + 8))((lws *)(sul + -7),0x49,sul[8].list.owner,0);
    if (iVar1 != 0) {
      __lws_close_free_wsi((lws *)(sul + -7),LWS_CLOSE_STATUS_NOSTATUS,"hrtimer cb errored");
    }
  }
  return;
}

Assistant:

static void
lws_sul_hrtimer_cb(lws_sorted_usec_list_t *sul)
{
	struct lws *wsi = lws_container_of(sul, struct lws, sul_hrtimer);

	if (wsi->protocol &&
	    wsi->protocol->callback(wsi, LWS_CALLBACK_TIMER,
				    wsi->user_space, NULL, 0))
		__lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
				     "hrtimer cb errored");
}